

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void textui_get_panel(wchar_t *min_y,wchar_t *min_x,wchar_t *max_y,wchar_t *max_x)

{
  term *ptVar1;
  term_conflict2 *t;
  wchar_t *max_x_local;
  wchar_t *max_y_local;
  wchar_t *min_x_local;
  wchar_t *min_y_local;
  
  ptVar1 = angband_term[0];
  if (angband_term[0] != (term *)0x0) {
    *min_y = angband_term[0]->offset_y;
    *min_x = ptVar1->offset_x;
    *max_y = ptVar1->offset_y +
             ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode]) /
             (int)(uint)tile_height;
    *max_x = ptVar1->offset_x +
             ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
  }
  return;
}

Assistant:

void textui_get_panel(int *min_y, int *min_x, int *max_y, int *max_x)
{
	term *t = term_screen;

	if (!t) return;

	*min_y = t->offset_y;
	*min_x = t->offset_x;
	*max_y = t->offset_y + SCREEN_HGT;
	*max_x = t->offset_x + SCREEN_WID;
}